

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineScriptFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,Instr *inlineeDefInstr,uint recursiveInlineDepth)

{
  ProfileId profiledCallSiteId;
  ScriptContext *scriptContext;
  Func *pFVar1;
  JITTimeWorkItem *this_00;
  code *pcVar2;
  Inline *pIVar3;
  bool bVar4;
  ExecutionMode EVar5;
  ArgSlot AVar6;
  uint sourceContextId;
  uint functionId;
  RegSlot RVar7;
  uint32 postCallByteCodeOffset;
  JITTimeFunctionBody *pJVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  undefined4 *puVar15;
  ProfiledInstr *pPVar16;
  Opnd *this_01;
  undefined4 extraout_var;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar17;
  intptr_t iVar18;
  FunctionJITTimeInfo *pFVar19;
  Func *this_02;
  JITOutputIDL *outputData;
  Instr *this_03;
  undefined6 in_register_00000082;
  byte bVar20;
  undefined4 uVar21;
  Instr *local_188;
  Instr *inlineBailoutChecksBeforeInstr;
  bool local_128 [8];
  bool safeThis;
  StackSym *local_c8;
  StackSym *local_c0;
  JITTimeWorkItem *local_b8;
  JITTimePolymorphicInlineCacheInfo *local_b0;
  ThreadContextInfo *local_a8;
  ScriptContextInfo *local_a0;
  JitArenaAllocator *local_98;
  Func *local_90;
  Instr *local_88;
  FunctionJITTimeDataIDL *local_80;
  RegOpnd *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ScriptContextProfiler *local_60;
  void *local_58;
  Func *local_50;
  Inline *local_48;
  JITTimeFunctionBody *local_40;
  TSize local_32;
  
  local_58 = (void *)CONCAT44(local_58._4_4_,(int)CONCAT62(in_register_00000082,profileId));
  *pIsInlined = false;
  local_c8 = symCallerThis;
  local_48 = this;
  if (this->topFunc->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  local_88 = callInstr->m_next;
  pFVar1 = callInstr->m_func;
  pJVar8 = FunctionJITTimeInfo::GetBody(inlineeData);
  bVar4 = Func::IsLoopBody(callInstr->m_func);
  if ((bVar4) && (bVar4 = JITTimeFunctionBody::UsesArgumentsObject(pJVar8), bVar4)) {
    return local_88;
  }
  local_40 = pJVar8;
  if ((callInstr->m_src2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsSymOpnd(callInstr->m_src2), bVar4))
  {
    pSVar9 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
    AVar6 = StackSym::GetArgSlotNum(pSVar10);
    pIVar3 = local_48;
    if (0xf < AVar6) {
      sourceContextId = Func::GetSourceContextId(local_48->topFunc);
      functionId = Func::GetLocalFunctionId(pIVar3->topFunc);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,sourceContextId,functionId);
      if (!bVar4) {
        return local_88;
      }
      pcVar11 = JITTimeFunctionBody::GetDisplayName(local_40);
      pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeData,(wchar (*) [42])&local_188);
      pSVar9 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
      pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
      AVar6 = StackSym::GetArgSlotNum(pSVar10);
      pJVar8 = Func::GetJITFunctionBody(pFVar1);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
      pcVar14 = Func::GetDebugNumberSet(pFVar1,(wchar (*) [42])local_128);
      Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                    ,pcVar11,pcVar12,(ulong)AVar6,0xf,pcVar13,pcVar14);
      Output::Flush();
      return local_88;
    }
  }
  *pIsInlined = true;
  local_c0 = IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar3 = local_48;
  local_60 = (ScriptContextProfiler *)CONCAT71(local_60._1_7_,callInstr->m_src1->field_0xb);
  local_128[0] = false;
  if ((callInstr->m_opcode == NewScObjArray) || (callInstr->m_opcode == NewScObject)) {
    bVar4 = TryOptimizeCallInstrWithFixedMethod
                      (local_48,callInstr,inlineeData,false,false,true,true,local_128,false,0);
    bVar4 = SplitConstructorCall(pIVar3,callInstr,true,bVar4,&local_188,(Instr **)0x0);
    uVar21 = (undefined4)CONCAT71((int7)((ulong)pIVar3 >> 8),1);
    if ((!bVar4) || (local_188 == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x10ac,"(split && inlineBailoutChecksBeforeInstr != nullptr)",
                         "split && inlineBailoutChecksBeforeInstr != nullptr");
      if (!bVar4) goto LAB_00500cf8;
      *puVar15 = 0;
    }
  }
  else {
    uVar21 = 0;
    TryOptimizeCallInstrWithFixedMethod
              (local_48,callInstr,inlineeData,false,false,false,true,local_128,false,0);
    local_188 = callInstr;
  }
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x10b5,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar4) {
LAB_00500cf8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar15 = 0;
  }
  local_80 = &inlineeData->m_data;
  pPVar16 = IR::Instr::AsProfiledInstr(callInstr);
  local_32 = (pPVar16->u).field_3.fldInfoData.f1;
  local_64 = uVar21;
  local_50 = pFVar1;
  if (callInstr->m_dst == (Opnd *)0x0) {
    local_70 = 0xffffffffffffffff;
    local_78 = (RegOpnd *)0x0;
  }
  else {
    this_01 = IR::Instr::UnlinkDst(callInstr);
    local_78 = IR::Opnd::AsRegOpnd(this_01);
    RVar7 = StackSym::GetByteCodeRegSlot(local_78->m_sym);
    local_70 = CONCAT44(extraout_var,RVar7);
  }
  pIVar3 = local_48;
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,local_48->topFunc->m_alloc,0x3d6ef4);
  bVar4 = Func::IsJitInDebugMode(pIVar3->topFunc);
  workItemData->isJitInDebugMode = bVar4;
  workItemData->type = '\0';
  EVar5 = JITTimeWorkItem::GetJitMode(pIVar3->topFunc->m_workItem);
  workItemData->jitMode = EVar5;
  pCVar17 = JITTimeWorkItem::GetWorkItemData(pIVar3->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar17->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = local_80;
  local_b8 = (JITTimeWorkItem *)
             new<Memory::JitArenaAllocator>(0x1e0,pIVar3->topFunc->m_alloc,0x3d6ef4);
  JITTimeWorkItem::JITTimeWorkItem(local_b8,workItemData);
  pJVar8 = local_40;
  this_00 = pIVar3->topFunc->m_workItem;
  iVar18 = JITTimeFunctionBody::GetAddr(local_40);
  local_b0 = JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,iVar18);
  if (inlineeDefInstr == (Instr *)0x0) {
    pFVar19 = JITTimeWorkItem::GetJITTimeInfo(local_50->m_workItem);
    iVar18 = JITTimeFunctionBody::GetAddr(pJVar8);
    local_40 = (JITTimeFunctionBody *)
               FunctionJITTimeInfo::GetInlineeForTargetInlineeRuntimeData
                         (pFVar19,(ProfileId)local_58,iVar18);
  }
  else {
    pFVar19 = JITTimeWorkItem::GetJITTimeInfo(inlineeDefInstr->m_func->m_workItem);
    pPVar16 = IR::Instr::AsProfiledInstr(inlineeDefInstr);
    profiledCallSiteId = (pPVar16->u).field_3.fldInfoData.f1;
    iVar18 = JITTimeFunctionBody::GetAddr(pJVar8);
    local_40 = (JITTimeFunctionBody *)
               FunctionJITTimeInfo::GetInlineeForCallbackInlineeRuntimeData
                         (pFVar19,profiledCallSiteId,iVar18);
  }
  pIVar3 = local_48;
  bVar20 = (byte)local_60 & 8;
  this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,local_48->topFunc->m_alloc,0x3d6ef4);
  pFVar1 = pIVar3->topFunc;
  local_98 = pFVar1->m_alloc;
  local_a8 = pFVar1->m_threadContextInfo;
  local_a0 = pFVar1->m_scriptContextInfo;
  outputData = JITOutput::GetOutputData(&pFVar1->m_output);
  pFVar1 = pIVar3->topFunc;
  local_60 = pFVar1->m_codeGenProfiler;
  local_58 = pFVar1->topFunc->m_codeGenAllocators;
  local_50 = (Func *)(ulong)pFVar1->m_isBackgroundJIT;
  local_90 = callInstr->m_func;
  this_03 = IR::Instr::GetNextRealInstr(callInstr);
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(this_03);
  Func::Func(this_02,local_98,local_b8,local_a8,local_a0,outputData,(EntryPointInfo *)0x0,
             (FunctionJITRuntimeInfo *)local_40,local_b0,local_58,local_60,SUB81(local_50,0),
             local_90,postCallByteCodeOffset,(RegSlot)local_70,local_64._0_1_,local_32,false);
  InlineFunctionCommon
            (pIVar3,callInstr,(bool)(bVar20 >> 3),local_c0,(FunctionJITTimeInfo *)local_80,this_02,
             local_88,local_78,local_188,local_c8,recursiveInlineDepth,local_128[0],false);
  return local_88;
}

Assistant:

IR::Instr *
Inline::InlineScriptFunction(IR::Instr *callInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, IR::Instr * inlineeDefInstr, uint recursiveInlineDepth)
{
    *pIsInlined = false;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::Instr *instrNext = callInstr->m_next;

    Func *funcCaller = callInstr->m_func;
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    // We don't do stack args optimization in jitted loop body (because of lack of information about the code before and after the loop)
    // and we turn off stack arg optimization for the whole inline chain if we can't do it for one of the functionss.
    // Inlining a function that uses arguments object could potentially hurt perf because we'll have to create arguments object on the
    // heap for that function (versus otherwise the function will be jitted and have its arguments object creation optimized).
    // TODO: Allow arguments object creation to be optimized on a function level instead of an all-or-nothing approach.
    if (callInstr->m_func->IsLoopBody() && funcBody->UsesArgumentsObject())
    {
        return instrNext;
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, funcCaller->GetJITFunctionBody()->GetDisplayName(), funcCaller->GetDebugNumberSet(debugStringBuffer2));
        return instrNext;
    }

    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // We are committed to inlining, optimize the call instruction for fixed fields now and don't attempt it later.
    bool isFixed = false;

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetJITFunctionBody()->GetDisplayName(), funcBody->GetDisplayName()));// REVIEW: OOP JIT, was GetExternalDisplayName, does this matter?

    bool isCtor = false;
    bool safeThis = false;
    IR::Instr *inlineBailoutChecksBeforeInstr;
    if (callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)
    {
        isCtor = true;
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        bool split = SplitConstructorCall(callInstr, true, isFixed, &inlineBailoutChecksBeforeInstr);
        Assert(split && inlineBailoutChecksBeforeInstr != nullptr);
    }
    else
    {
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        inlineBailoutChecksBeforeInstr = callInstr;
    }

    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);


    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
    const FunctionJITRuntimeInfo * runtimeInfo = (inlineeDefInstr == nullptr)
        ? funcCaller->GetWorkItem()->GetJITTimeInfo()->GetInlineeForTargetInlineeRuntimeData(profileId, funcBody->GetAddr())
        : inlineeDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetInlineeForCallbackInlineeRuntimeData(static_cast<Js::ProfileId>(inlineeDefInstr->AsProfiledInstr()->u.profileId), funcBody->GetAddr());

#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#endif

    return InlineFunctionCommon(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}